

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
::emplace_at<std::piecewise_construct_t_const&,std::tuple<char_const(&)[20]>,std::tuple<>>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           *this,iterator iter,piecewise_construct_t *args,tuple<const_char_(&)[20]> *args_1,
          tuple<> *args_2)

{
  bool bVar1;
  reference args_00;
  FindElement local_60;
  anon_union_8_1_a8a14541_for_iterator_2 local_58;
  anon_union_8_1_a8a14541_for_iterator_2 local_50;
  iterator local_48;
  iterator local_38;
  
  local_38.field_1 = iter.field_1;
  local_38.ctrl_ = iter.ctrl_;
  local_50 = (anon_union_8_1_a8a14541_for_iterator_2)
             (anon_union_8_1_a8a14541_for_iterator_2)local_58.slot_;
  local_58 = (anon_union_8_1_a8a14541_for_iterator_2)
             (args_1->super__Tuple_impl<0UL,_const_char_(&)[20]>).
             super__Head_base<0UL,_const_char_(&)[20],_false>._M_head_impl;
  std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>::
  pair<char_const(&)[20]>
            ((pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string> *)
             local_38.field_1.slot_,&local_58);
  local_60.s = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this;
  args_00 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::iterator::operator*(&local_38);
  _local_58 = (iterator)
              DecomposePair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>::FindElement,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>&>
                        (&local_60,args_00);
  local_48.ctrl_ = local_38.ctrl_;
  local_48.field_1.slot_ = (slot_type *)local_38.field_1;
  bVar1 = container_internal::operator==((iterator *)&local_58,&local_48);
  if (bVar1) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf3f,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>, Args = <const std::piecewise_construct_t &, std::tuple<const char (&)[20]>, std::tuple<>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }